

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::ForgetSynchEvent(atomic<long> *addr,intptr_t bits,intptr_t lockbit)

{
  SynchEvent *e_00;
  uintptr_t uVar1;
  int iVar2;
  uintptr_t uVar3;
  bool bVar4;
  bool del;
  SynchEvent *e;
  SynchEvent **pe;
  uint32_t h;
  intptr_t lockbit_local;
  intptr_t bits_local;
  atomic<long> *addr_local;
  
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  e = (SynchEvent *)(synch_event + ((long)addr % 0x407 & 0xffffffffU) * 8);
  while( true ) {
    e_00 = *(SynchEvent **)e;
    bVar4 = false;
    if (e_00 != (SynchEvent *)0x0) {
      uVar1 = e_00->masked_addr;
      uVar3 = base_internal::HidePtr<std::atomic<long>>(addr);
      bVar4 = uVar1 != uVar3;
    }
    if (!bVar4) break;
    e = (SynchEvent *)&e_00->next;
  }
  bVar4 = false;
  if (e_00 != (SynchEvent *)0x0) {
    *(SynchEvent **)e = e_00->next;
    iVar2 = e_00->refcount + -1;
    e_00->refcount = iVar2;
    bVar4 = iVar2 == 0;
  }
  AtomicClearBits(addr,bits,lockbit);
  base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
  if (bVar4) {
    DeleteSynchEvent(e_00);
  }
  return;
}

Assistant:

static void ForgetSynchEvent(std::atomic<intptr_t> *addr, intptr_t bits,
                             intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent **pe;
  SynchEvent *e;
  synch_event_mu.Lock();
  for (pe = &synch_event[h];
       (e = *pe) != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       pe = &e->next) {
  }
  bool del = false;
  if (e != nullptr) {
    *pe = e->next;
    del = (--(e->refcount) == 0);
  }
  AtomicClearBits(addr, bits, lockbit);
  synch_event_mu.Unlock();
  if (del) {
    DeleteSynchEvent(e);
  }
}